

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hrtime.c
# Opt level: O2

int run_test_hrtime(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = -0x4c;
  do {
    iVar3 = iVar3 + 1;
    if (iVar3 == 0) {
      return 0;
    }
    lVar1 = uv_hrtime();
    uv_sleep(0x2d);
    lVar2 = uv_hrtime();
  } while (25000000 < (ulong)(lVar2 - lVar1));
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-hrtime.c"
          ,0x30,"diff > (uint64_t) 25 * NANOSEC / MILLISEC");
  abort();
}

Assistant:

TEST_IMPL(hrtime) {
  uint64_t a, b, diff;
  int i = 75;
  while (i > 0) {
    a = uv_hrtime();
    uv_sleep(45);
    b = uv_hrtime();

    diff = b - a;

    /* The windows Sleep() function has only a resolution of 10-20 ms. Check
     * that the difference between the two hrtime values has a reasonable
     * lower bound.
     */
    ASSERT(diff > (uint64_t) 25 * NANOSEC / MILLISEC);
    --i;
  }
  return 0;
}